

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void __thiscall cbtCollisionWorld::updateAabbs(cbtCollisionWorld *this)

{
  int iVar1;
  cbtCollisionObject *colObj;
  int iVar2;
  long lVar3;
  CProfileSample __profile;
  CProfileSample local_11;
  
  CProfileSample::CProfileSample(&local_11,"updateAabbs");
  iVar2 = (this->m_collisionObjects).m_size;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      colObj = (this->m_collisionObjects).m_data[lVar3];
      if ((this->m_forceUpdateAllAabbs != false) ||
         ((iVar1 = colObj->m_activationState1, iVar1 != 2 && (iVar1 != 5)))) {
        updateSingleAabb(this,colObj);
        iVar2 = (this->m_collisionObjects).m_size;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  CProfileSample::~CProfileSample(&local_11);
  return;
}

Assistant:

void cbtCollisionWorld::updateAabbs()
{
	BT_PROFILE("updateAabbs");

	cbtTransform predictedTrans;
	for (int i = 0; i < m_collisionObjects.size(); i++)
	{
		cbtCollisionObject* colObj = m_collisionObjects[i];
		cbtAssert(colObj->getWorldArrayIndex() == i);

		//only update aabb of active objects
		if (m_forceUpdateAllAabbs || colObj->isActive())
		{
			updateSingleAabb(colObj);
		}
	}
}